

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

int Socket(void)

{
  int __fd;
  int iVar1;
  undefined1 local_18 [4];
  int server_fd;
  sockaddr_in address;
  
  __fd = socket(2,1,0);
  if (__fd == 0) {
    perror("In socket");
    exit(1);
  }
  local_18._0_2_ = 2;
  server_fd = 0;
  local_18._2_2_ = htons((uint16_t)SERVER_PORT);
  memset(&address,0,8);
  iVar1 = bind(__fd,(sockaddr *)local_18,0x10);
  if (iVar1 < 0) {
    perror("In bind");
    exit(1);
  }
  iVar1 = listen(__fd,10);
  if (iVar1 < 0) {
    perror("In listen");
    exit(1);
  }
  return __fd;
}

Assistant:

int Socket() {

    struct sockaddr_in address;
    int server_fd;

    if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) {
        perror("In socket");
        exit(EXIT_FAILURE);
    }

    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(SERVER_PORT);

    memset(address.sin_zero, '\0', sizeof address.sin_zero);


    if (bind(server_fd, (struct sockaddr *) &address, sizeof(address)) < 0) {
        perror("In bind");
        exit(EXIT_FAILURE);
    }

    if (listen(server_fd, 10) < 0) {
        perror("In listen");
        exit(EXIT_FAILURE);
    }

    return server_fd;
}